

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadMessage
               (CodedInputStream *input,MessageLite *value)

{
  uint8 uVar1;
  uint8 *puVar2;
  bool bVar3;
  Limit limit;
  int iVar4;
  uint32 length;
  uint32 local_1c;
  
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
    input->buffer_ = puVar2 + 1;
    local_1c = (int)(char)uVar1;
  }
  else {
    bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,&local_1c);
    if (!bVar3) {
      return false;
    }
  }
  iVar4 = input->recursion_depth_;
  input->recursion_depth_ = iVar4 + 1;
  if (iVar4 < input->recursion_limit_) {
    limit = io::CodedInputStream::PushLimit(input,local_1c);
    iVar4 = (*value->_vptr_MessageLite[8])(value,input);
    if (((char)iVar4 != '\0') && (input->legitimate_message_end_ == true)) {
      io::CodedInputStream::PopLimit(input,limit);
      if (0 < input->recursion_depth_) {
        input->recursion_depth_ = input->recursion_depth_ + -1;
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadMessage(io::CodedInputStream* input,
                                        MessageLite* value) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  if (!input->IncrementRecursionDepth()) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  if (!value->MergePartialFromCodedStream(input)) return false;
  // Make sure that parsing stopped when the limit was hit, not at an endgroup
  // tag.
  if (!input->ConsumedEntireMessage()) return false;
  input->PopLimit(limit);
  input->DecrementRecursionDepth();
  return true;
}